

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O0

type_conflict2
jsoncons::detail::
encode_base64_generic<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__cxx11::wstring>
          (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           first,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 last,char *alphabet,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result)

{
  char cVar1;
  bool bVar2;
  reference puVar3;
  undefined8 in_RCX;
  long in_RDX;
  int j;
  int i;
  uchar fill;
  uchar a4 [4];
  uchar a3 [3];
  size_t count;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uchar local_2b [3];
  type_conflict2 local_28;
  undefined8 local_20;
  
  local_28 = 0;
  cVar1 = *(char *)(in_RDX + 0x40);
  uVar4 = 0;
  iVar6 = 0;
  local_20 = in_RCX;
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8),
        bVar2) {
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::operator++((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)CONCAT44(iVar6,uVar4),
                      (int)((ulong)in_stack_ffffffffffffffc0._M_current >> 0x20));
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&stack0xffffffffffffffc0);
    iVar5 = iVar6 + 1;
    local_2b[iVar6] = *puVar3;
    iVar6 = iVar5;
    if (iVar5 == 3) {
      for (iVar6 = 0; iVar6 < 4; iVar6 = iVar6 + 1) {
        std::__cxx11::wstring::push_back((wchar_t)local_20);
        local_28 = local_28 + 1;
      }
      iVar6 = 0;
    }
  }
  iVar5 = iVar6;
  if (0 < iVar6) {
    for (; iVar5 < 3; iVar5 = iVar5 + 1) {
      local_2b[iVar5] = '\0';
    }
    for (iVar5 = 0; iVar5 < iVar6 + 1; iVar5 = iVar5 + 1) {
      std::__cxx11::wstring::push_back((wchar_t)local_20);
      local_28 = local_28 + 1;
    }
    if (cVar1 != '\0') {
      while (iVar5 = iVar6 + 1, iVar6 < 3) {
        std::__cxx11::wstring::push_back((wchar_t)local_20);
        local_28 = local_28 + 1;
        iVar6 = iVar5;
      }
    }
  }
  return local_28;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base64_generic(InputIt first, InputIt last, const char alphabet[65], Container& result)
    {
        std::size_t count = 0;
        unsigned char a3[3];
        unsigned char a4[4];
        unsigned char fill = alphabet[64];
        int i = 0;
        int j = 0;

        while (first != last)
        {
            a3[i++] = *first++;
            if (i == 3)
            {
                a4[0] = (a3[0] & 0xfc) >> 2;
                a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
                a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);
                a4[3] = a3[2] & 0x3f;

                for (i = 0; i < 4; i++) 
                {
                    result.push_back(alphabet[a4[i]]);
                    ++count;
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = i; j < 3; ++j) 
            {
                a3[j] = 0;
            }

            a4[0] = (a3[0] & 0xfc) >> 2;
            a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
            a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);

            for (j = 0; j < i + 1; ++j) 
            {
                result.push_back(alphabet[a4[j]]);
                ++count;
            }

            if (fill != 0)
            {
                while (i++ < 3) 
                {
                    result.push_back(fill);
                    ++count;
                }
            }
        }

        return count;
    }